

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall
WavingSketch<8U,_16U,_4U>::Init(WavingSketch<8U,_16U,_4U> *this,Data<4U> *item,uint time)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  uint position;
  uint uVar4;
  uint uVar5;
  uint8_t *data;
  uint uVar6;
  bool bVar7;
  uint32_t k1;
  
  if (this->record < time) {
    this->record = time;
    memset(this->bitset->bitset,0,(ulong)(this->bitset->LENGTH >> 3) + 1);
  }
  uVar6 = this->HASH_NUM;
  if (uVar6 == 0) {
    return;
  }
  uVar5 = 0;
  bVar7 = true;
  do {
    puVar2 = this->bitset->bitset;
    while( true ) {
      uVar4 = ((uint)(*(int *)item->str * -0x3361d2af) >> 0x11 | *(int *)item->str * 0x16a88000) *
              0x1b873593 ^ uVar5;
      uVar4 = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64;
      uVar4 = (uVar4 >> 0x10 ^ uVar4 ^ 4) * -0x7a143595;
      uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
      uVar3 = (ulong)(uVar4 >> 0x10 ^ uVar4) % (ulong)this->LENGTH;
      bVar1 = puVar2[uVar3 >> 3];
      if ((bVar1 >> ((uint)uVar3 & 7) & 1) == 0) break;
      uVar5 = uVar5 + 1;
      if (uVar6 <= uVar5) {
        if (bVar7) {
          return;
        }
        goto LAB_0010a0b4;
      }
    }
    puVar2[uVar3 >> 3] = (byte)(1 << ((byte)uVar3 & 7)) | bVar1;
    uVar6 = this->HASH_NUM;
    uVar5 = uVar5 + 1;
    bVar7 = false;
    if (uVar6 <= uVar5) {
LAB_0010a0b4:
      (**(this->super_Abstract<4U>)._vptr_Abstract)(this,item);
      return;
    }
  } while( true );
}

Assistant:

void Init(const Data<DATA_LEN>& item, uint time) {
		if (time > record) {
			record = time;
			bitset->Clear();
		}

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = item.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(item);
	}